

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  stat buf;
  char *local_e8;
  undefined1 local_c0 [24];
  uint local_a8;
  
  iVar9 = 1;
  local_e8 = (char *)0x0;
  do {
    iVar2 = (*aSyscall[0x1b].pCurrent)(zPath,local_c0);
    if (iVar2 != 0) {
      puVar3 = (uint *)__errno_location();
      bVar1 = true;
      if (*puVar3 == 2) goto LAB_00116510;
      sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e7d,
                  "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
      uVar10 = *puVar3;
      if (zPath == (char *)0x0) {
        zPath = "";
      }
      pcVar11 = "lstat";
      uVar8 = 0x8e7d;
LAB_001166ae:
      iVar9 = 0xe;
      sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",uVar8,(ulong)uVar10,pcVar11,zPath,"");
      goto LAB_001166bd;
    }
    bVar1 = true;
    if ((local_a8 & 0xf000) == 0xa000) {
      if (local_e8 == (char *)0x0) {
        local_e8 = (char *)sqlite3_malloc(nOut);
        if (local_e8 == (char *)0x0) {
          iVar9 = 7;
          local_e8 = (char *)0x0;
          goto LAB_001166bd;
        }
      }
      else {
        if (99 < iVar9) {
          iVar9 = 0xe;
          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e88,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          goto LAB_001166bd;
        }
        iVar9 = iVar9 + 1;
      }
      uVar10 = (*aSyscall[0x1a].pCurrent)(zPath,local_e8,(long)(nOut + -1));
      if ((int)uVar10 < 0) {
        iVar9 = 0xe;
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e8e,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        puVar3 = (uint *)__errno_location();
        if (zPath == (char *)0x0) {
          zPath = "";
        }
        sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0x8e8e,(ulong)*puVar3,"readlink",zPath,"");
        goto LAB_001166bd;
      }
      if (*local_e8 != '/') {
        if (zPath == (char *)0x0) {
          uVar4 = 0;
        }
        else {
          sVar5 = strlen(zPath);
          uVar4 = (ulong)((uint)sVar5 & 0x3fffffff);
        }
        do {
          uVar7 = uVar4 - 1;
          if (uVar4 == 0) {
            uVar12 = 0;
            goto LAB_001164cc;
          }
          lVar6 = uVar4 - 1;
          uVar4 = uVar7;
        } while (zPath[lVar6] != '/');
        uVar12 = (int)uVar7 + 1;
LAB_001164cc:
        if (nOut <= (int)(uVar12 + uVar10)) {
          iVar9 = 0xe;
          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e94,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          local_e8[uVar10 & 0x7fffffff] = '\0';
          goto LAB_001166bd;
        }
        memmove(local_e8 + uVar12,local_e8,(ulong)(uVar10 + 1));
        memcpy(local_e8,zPath,(ulong)uVar12);
        uVar10 = uVar12 + uVar10;
      }
      local_e8[uVar10] = '\0';
      bVar1 = false;
      zPath = local_e8;
    }
LAB_00116510:
    if (zPath != zOut) {
      uVar4 = 0;
      uVar10 = 0;
      if (zPath != (char *)0x0) {
        sVar5 = strlen(zPath);
        uVar10 = (uint)sVar5 & 0x3fffffff;
      }
      if (*zPath != '/') {
        lVar6 = (*aSyscall[3].pCurrent)(zOut,(long)(nOut + -2));
        if (lVar6 == 0) {
          sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e44,
                      "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
          puVar3 = (uint *)__errno_location();
          uVar10 = *puVar3;
          pcVar11 = "getcwd";
          uVar8 = 0x8e44;
          goto LAB_001166ae;
        }
        if (zOut == (char *)0x0) {
          uVar12 = 0;
        }
        else {
          sVar5 = strlen(zOut);
          uVar12 = (uint)sVar5 & 0x3fffffff;
        }
        uVar4 = (ulong)(uVar12 + 1);
        zOut[uVar12] = '/';
      }
      if (nOut <= (int)(uVar10 + (int)uVar4)) {
        zOut[uVar4] = '\0';
        iVar9 = 0xe;
        sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0x8e4d,
                    "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
        goto LAB_001166bd;
      }
      sqlite3_snprintf(nOut - (int)uVar4,zOut + uVar4,"%s",zPath);
    }
    zPath = zOut;
  } while (!bVar1);
  iVar9 = 0;
LAB_001166bd:
  sqlite3_free(local_e8);
  return iVar9;
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
#if !defined(HAVE_READLINK) || !defined(HAVE_LSTAT)
  return mkFullPathname(zPath, zOut, nOut);
#else
  int rc = SQLITE_OK;
  int nByte;
  int nLink = 1;                /* Number of symbolic links followed so far */
  const char *zIn = zPath;      /* Input path for each iteration of loop */
  char *zDel = 0;

  assert( pVfs->mxPathname==MAX_PATHNAME );
  UNUSED_PARAMETER(pVfs);

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. This function could fail if, for example, the
  ** current working directory has been unlinked.
  */
  SimulateIOError( return SQLITE_ERROR );

  do {

    /* Call stat() on path zIn. Set bLink to true if the path is a symbolic
    ** link, or false otherwise.  */
    int bLink = 0;
    struct stat buf;
    if( osLstat(zIn, &buf)!=0 ){
      if( errno!=ENOENT ){
        rc = unixLogError(SQLITE_CANTOPEN_BKPT, "lstat", zIn);
      }
    }else{
      bLink = S_ISLNK(buf.st_mode);
    }

    if( bLink ){
      if( zDel==0 ){
        zDel = sqlite3_malloc(nOut);
        if( zDel==0 ) rc = SQLITE_NOMEM_BKPT;
      }else if( ++nLink>SQLITE_MAX_SYMLINKS ){
        rc = SQLITE_CANTOPEN_BKPT;
      }

      if( rc==SQLITE_OK ){
        nByte = osReadlink(zIn, zDel, nOut-1);
        if( nByte<0 ){
          rc = unixLogError(SQLITE_CANTOPEN_BKPT, "readlink", zIn);
        }else{
          if( zDel[0]!='/' ){
            int n;
            for(n = sqlite3Strlen30(zIn); n>0 && zIn[n-1]!='/'; n--);
            if( nByte+n+1>nOut ){
              rc = SQLITE_CANTOPEN_BKPT;
            }else{
              memmove(&zDel[n], zDel, nByte+1);
              memcpy(zDel, zIn, n);
              nByte += n;
            }
          }
          zDel[nByte] = '\0';
        }
      }

      zIn = zDel;
    }

    assert( rc!=SQLITE_OK || zIn!=zOut || zIn[0]=='/' );
    if( rc==SQLITE_OK && zIn!=zOut ){
      rc = mkFullPathname(zIn, zOut, nOut);
    }
    if( bLink==0 ) break;
    zIn = zOut;
  }while( rc==SQLITE_OK );

  sqlite3_free(zDel);
  return rc;
#endif   /* HAVE_READLINK && HAVE_LSTAT */
}